

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O0

void Abc_NtkBddToMuxesPerform(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkNew)

{
  int iVar1;
  Vec_Ptr_t *p;
  ProgressBar *p_00;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar2;
  int local_3c;
  int i;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pNode;
  ProgressBar *pProgress;
  Abc_Ntk_t *pNtkNew_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Abc_NtkDfs(pNtk,0);
  p_00 = Extra_ProgressBarStart(_stdout,p->nSize);
  local_3c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p);
    if (iVar1 <= local_3c) {
      Vec_PtrFree(p);
      Extra_ProgressBarStop(p_00);
      return;
    }
    pObj = (Abc_Obj_t *)Vec_PtrEntry(p,local_3c);
    Extra_ProgressBarUpdate(p_00,local_3c,(char *)0x0);
    iVar1 = Abc_ObjIsNode(pObj);
    if (iVar1 == 0) break;
    pAVar2 = Abc_NodeBddToMuxes(pObj,pNtkNew);
    if ((pObj->field_6).pTemp != (void *)0x0) {
      __assert_fail("pNode->pCopy == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNtbdd.c"
                    ,0xaf,"void Abc_NtkBddToMuxesPerform(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    (pObj->field_6).pCopy = pAVar2;
    local_3c = local_3c + 1;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNtbdd.c"
                ,0xac,"void Abc_NtkBddToMuxesPerform(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkBddToMuxesPerform( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkNew )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pNode, * pNodeNew;
    Vec_Ptr_t * vNodes;
    int i;
    // perform conversion in the topological order
    vNodes = Abc_NtkDfs( pNtk, 0 );
    pProgress = Extra_ProgressBarStart( stdout, vNodes->nSize );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // convert one node
        assert( Abc_ObjIsNode(pNode) );
        pNodeNew = Abc_NodeBddToMuxes( pNode, pNtkNew );
        // mark the old node with the new one
        assert( pNode->pCopy == NULL );
        pNode->pCopy = pNodeNew;
    }
    Vec_PtrFree( vNodes );
    Extra_ProgressBarStop( pProgress );
}